

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_pclmulqdq_tpl.h
# Opt level: O0

void fold_12(__m128i *xmm_crc0,__m128i *xmm_crc1,__m128i *xmm_crc2,__m128i *xmm_crc3)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  __m128 ps_crc3;
  __m128 ps_crc2;
  __m128 ps_crc1;
  __m128 ps_crc0;
  __m128i x_tmp3;
  __m128i x_tmp2;
  __m128i x_tmp1;
  __m128i x_tmp0;
  __m128i xmm_fold12;
  ulong local_1d8;
  ulong uStack_1d0;
  ulong local_1c8;
  ulong uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  ulong local_1a8;
  ulong uStack_1a0;
  __m128 ps_res3;
  __m128 ps_res2;
  __m128 ps_res1;
  __m128 ps_res0;
  __m128 ps_t3;
  __m128 ps_t2;
  __m128 ps_t1;
  __m128 ps_t0;
  
  auVar1 = vpunpcklqdq_avx(ZEXT816(0xf5e48c85),ZEXT816(0x596c8d81));
  ps_t2._8_8_ = auVar1._0_8_;
  ps_t1._0_8_ = auVar1._8_8_;
  uVar19 = *(ulong *)*in_RSI;
  uVar20 = *(ulong *)*in_RDX;
  uVar21 = *(ulong *)*in_RCX;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(*in_RDI + 8);
  auVar7._8_8_ = 0;
  auVar7._0_4_ = ps_t2[2];
  auVar7._4_4_ = ps_t2[3];
  auVar1 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar3 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar1 = auVar1 ^ auVar7 << uVar2;
    }
  }
  *in_RDI = auVar1;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)*in_RDI;
  auVar15._8_8_ = 0;
  auVar15._0_4_ = ps_t1[0];
  auVar15._4_4_ = ps_t1[1];
  auVar1 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar11 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar1 = auVar1 ^ auVar15 << uVar2;
    }
  }
  uVar22 = *(ulong *)*in_RDI;
  uVar23 = *(ulong *)(*in_RDI + 8);
  local_1a8 = auVar1._0_8_;
  uStack_1a0 = auVar1._8_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(*in_RSI + 8);
  auVar8._8_8_ = 0;
  auVar8._0_4_ = ps_t2[2];
  auVar8._4_4_ = ps_t2[3];
  auVar1 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar4 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar1 = auVar1 ^ auVar8 << uVar2;
    }
  }
  *in_RSI = auVar1;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar19;
  auVar16._8_8_ = 0;
  auVar16._0_4_ = ps_t1[0];
  auVar16._4_4_ = ps_t1[1];
  auVar1 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar12 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar1 = auVar1 ^ auVar16 << uVar2;
    }
  }
  uVar19 = *(ulong *)*in_RSI;
  uVar24 = *(ulong *)(*in_RSI + 8);
  local_1b8 = auVar1._0_8_;
  uStack_1b0 = auVar1._8_8_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(*in_RDX + 8);
  auVar9._8_8_ = 0;
  auVar9._0_4_ = ps_t2[2];
  auVar9._4_4_ = ps_t2[3];
  auVar1 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar5 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar1 = auVar1 ^ auVar9 << uVar2;
    }
  }
  *in_RDX = auVar1;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar20;
  auVar17._8_8_ = 0;
  auVar17._0_4_ = ps_t1[0];
  auVar17._4_4_ = ps_t1[1];
  auVar1 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar13 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar1 = auVar1 ^ auVar17 << uVar2;
    }
  }
  uVar20 = *(ulong *)*in_RDX;
  uVar25 = *(ulong *)(*in_RDX + 8);
  local_1c8 = auVar1._0_8_;
  uStack_1c0 = auVar1._8_8_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(*in_RCX + 8);
  auVar10._8_8_ = 0;
  auVar10._0_4_ = ps_t2[2];
  auVar10._4_4_ = ps_t2[3];
  auVar1 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar6 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar1 = auVar1 ^ auVar10 << uVar2;
    }
  }
  *in_RCX = auVar1;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar21;
  auVar18._8_8_ = 0;
  auVar18._0_4_ = ps_t1[0];
  auVar18._4_4_ = ps_t1[1];
  auVar1 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar14 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar1 = auVar1 ^ auVar18 << uVar2;
    }
  }
  uVar21 = *(ulong *)*in_RCX;
  uVar26 = *(ulong *)(*in_RCX + 8);
  local_1d8 = auVar1._0_8_;
  uStack_1d0 = auVar1._8_8_;
  *(ulong *)*in_RDI = uVar22 ^ local_1a8;
  *(ulong *)(*in_RDI + 8) = uVar23 ^ uStack_1a0;
  *(ulong *)*in_RSI = uVar19 ^ local_1b8;
  *(ulong *)(*in_RSI + 8) = uVar24 ^ uStack_1b0;
  *(ulong *)*in_RDX = uVar20 ^ local_1c8;
  *(ulong *)(*in_RDX + 8) = uVar25 ^ uStack_1c0;
  *(ulong *)*in_RCX = uVar21 ^ local_1d8;
  *(ulong *)(*in_RCX + 8) = uVar26 ^ uStack_1d0;
  return;
}

Assistant:

static void fold_12(__m128i *xmm_crc0, __m128i *xmm_crc1, __m128i *xmm_crc2, __m128i *xmm_crc3) {
    const __m128i xmm_fold12 = _mm_set_epi64x(0x596C8D81, 0xF5E48C85);
    __m128i x_tmp0, x_tmp1, x_tmp2, x_tmp3;
    __m128 ps_crc0, ps_crc1, ps_crc2, ps_crc3;
    __m128 ps_t0, ps_t1, ps_t2, ps_t3;
    __m128 ps_res0, ps_res1, ps_res2, ps_res3;

    x_tmp0 = *xmm_crc0;
    x_tmp1 = *xmm_crc1;
    x_tmp2 = *xmm_crc2;
    x_tmp3 = *xmm_crc3;

    *xmm_crc0 = _mm_clmulepi64_si128(*xmm_crc0, xmm_fold12, 0x01);
    x_tmp0 = _mm_clmulepi64_si128(x_tmp0, xmm_fold12, 0x10);
    ps_crc0 = _mm_castsi128_ps(*xmm_crc0);
    ps_t0 = _mm_castsi128_ps(x_tmp0);
    ps_res0 = _mm_xor_ps(ps_crc0, ps_t0);

    *xmm_crc1 = _mm_clmulepi64_si128(*xmm_crc1, xmm_fold12, 0x01);
    x_tmp1 = _mm_clmulepi64_si128(x_tmp1, xmm_fold12, 0x10);
    ps_crc1 = _mm_castsi128_ps(*xmm_crc1);
    ps_t1 = _mm_castsi128_ps(x_tmp1);
    ps_res1 = _mm_xor_ps(ps_crc1, ps_t1);

    *xmm_crc2 = _mm_clmulepi64_si128(*xmm_crc2, xmm_fold12, 0x01);
    x_tmp2 = _mm_clmulepi64_si128(x_tmp2, xmm_fold12, 0x10);
    ps_crc2 = _mm_castsi128_ps(*xmm_crc2);
    ps_t2 = _mm_castsi128_ps(x_tmp2);
    ps_res2 = _mm_xor_ps(ps_crc2, ps_t2);

    *xmm_crc3 = _mm_clmulepi64_si128(*xmm_crc3, xmm_fold12, 0x01);
    x_tmp3 = _mm_clmulepi64_si128(x_tmp3, xmm_fold12, 0x10);
    ps_crc3 = _mm_castsi128_ps(*xmm_crc3);
    ps_t3 = _mm_castsi128_ps(x_tmp3);
    ps_res3 = _mm_xor_ps(ps_crc3, ps_t3);

    *xmm_crc0 = _mm_castps_si128(ps_res0);
    *xmm_crc1 = _mm_castps_si128(ps_res1);
    *xmm_crc2 = _mm_castps_si128(ps_res2);
    *xmm_crc3 = _mm_castps_si128(ps_res3);
}